

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

char * fmt_bit_array(bit_array_t *bit_array)

{
  ushort uVar1;
  ulong uVar2;
  byte_t *pbVar3;
  ulong uVar4;
  
  uVar1 = bit_array->length;
  uVar2 = 0xff;
  if (uVar1 < 0xff) {
    uVar2 = (ulong)uVar1;
  }
  pbVar3 = bit_array->buffer + ((ulong)uVar1 - 1);
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    fmt_bit_array::str[uVar4] = *pbVar3;
    pbVar3 = pbVar3 + -1;
  }
  fmt_bit_array::str[uVar2] = '\0';
  return fmt_bit_array::str;
}

Assistant:

char * fmt_bit_array(const bit_array_t *bit_array) {
    static char str[MAX_BIT_STR] = {0};

    int j = 0;
    for(int i = bit_array->length-1; i>=0 && (j < sizeof(str)-2); i--) {
        str[j] = bit_array->buffer[i];
        j++;
    }

    str[j] = 0;
    return str;
}